

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O1

void __thiscall
cmCacheManager::WritePropertyEntries(cmCacheManager *this,ostream *os,CacheIterator *i)

{
  _Base_ptr p_Var1;
  long lVar2;
  char *pcVar3;
  size_t sVar4;
  char **ppcVar5;
  string key;
  string helpstring;
  string local_90;
  string local_70;
  string local_50;
  
  if (PersistentProperties[0] != (char *)0x0) {
    ppcVar5 = PersistentProperties;
    pcVar3 = PersistentProperties[0];
    do {
      std::__cxx11::string::string((string *)&local_70,pcVar3,(allocator *)&local_90);
      p_Var1 = (i->Position)._M_node;
      if ((_Rb_tree_header *)p_Var1 == &(i->Container->Cache)._M_t._M_impl.super__Rb_tree_header) {
        pcVar3 = (char *)0x0;
      }
      else {
        pcVar3 = CacheEntry::GetProperty((CacheEntry *)(p_Var1 + 2),&local_70);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (pcVar3 != (char *)0x0) {
        std::__cxx11::string::string((string *)&local_70,*ppcVar5,(allocator *)&local_90);
        std::__cxx11::string::append((char *)&local_70);
        p_Var1 = (i->Position)._M_node;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        lVar2 = *(long *)(p_Var1 + 1);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,lVar2,(long)&(p_Var1[1]._M_parent)->_M_color + lVar2);
        std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        OutputHelpString(os,&local_70);
        p_Var1 = (i->Position)._M_node;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        lVar2 = *(long *)(p_Var1 + 1);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,lVar2,(long)&(p_Var1[1]._M_parent)->_M_color + lVar2);
        std::__cxx11::string::append((char *)&local_90);
        std::__cxx11::string::append((char *)&local_90);
        OutputKey(os,&local_90);
        std::__ostream_insert<char,std::char_traits<char>>(os,":INTERNAL=",10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        sVar4 = strlen(pcVar3);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar3,pcVar3 + sVar4);
        OutputValue(os,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar3 = ppcVar5[1];
      ppcVar5 = ppcVar5 + 1;
    } while (pcVar3 != (char *)0x0);
  }
  return;
}

Assistant:

void cmCacheManager::WritePropertyEntries(std::ostream& os,
                                          CacheIterator const& i)
{
  for(const char** p = this->PersistentProperties; *p; ++p)
    {
    if(const char* value = i.GetProperty(*p))
      {
      std::string helpstring = *p;
      helpstring += " property for variable: ";
      helpstring += i.GetName();
      cmCacheManager::OutputHelpString(os, helpstring);

      std::string key = i.GetName();
      key += "-";
      key += *p;
      this->OutputKey(os, key);
      os << ":INTERNAL=";
      this->OutputValue(os, value);
      os << "\n";
      }
    }
}